

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_switch.cpp
# Opt level: O1

void __thiscall DActiveButton::DActiveButton(DActiveButton *this)

{
  DThinker::DThinker(&this->super_DThinker,100);
  (this->super_DThinker).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_007017a8;
  this->m_Side = (side_t *)0x0;
  this->m_Part = -1;
  this->bFlippable = false;
  this->bReturning = false;
  this->m_SwitchDef = (FSwitchDef *)0x0;
  this->m_Frame = 0;
  this->m_Timer = 0;
  (this->m_Pos).X = 0.0;
  (this->m_Pos).Y = 0.0;
  return;
}

Assistant:

DActiveButton::DActiveButton ()
{
	m_Side = NULL;
	m_Part = -1;
	m_SwitchDef = 0;
	m_Timer = 0;
	m_Pos = { 0,0 };
	bFlippable = false;
	bReturning = false;
	m_Frame = 0;
}